

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeFirstAlgorithm.cpp
# Opt level: O0

void __thiscall
van_kampen::LargeFirstAlgorithm::generate
          (LargeFirstAlgorithm *this,
          vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
          *words)

{
  allocator<bool> *this_00;
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  unsigned_long *puVar5;
  size_type __n;
  const_reference __x;
  const_iterator cVar6;
  __normal_iterator<const_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
  _Var7;
  size_t sVar8;
  ostream *poVar9;
  int local_184;
  undefined1 auStack_180 [2];
  bool success;
  bool infinite;
  int rest;
  anon_class_16_2_12726816 prevNotAdded;
  anon_class_16_2_12726816 nextNotAdded;
  __normal_iterator<const_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
  local_150;
  __normal_iterator<const_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
  bigIt;
  const_iterator smallIt;
  anon_class_48_6_f85bbd33 add;
  undefined1 auStack_108 [6];
  bool force;
  bool oneAdded;
  _Bit_type local_100;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> local_f8;
  undefined1 local_e0 [8];
  anon_class_16_2_0b5c3d9c added;
  undefined1 local_c8 [8];
  vector<bool,_std::allocator<bool>_> isAdded;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  ProcessLogger logger;
  size_t totalIterations;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  *words_local;
  LargeFirstAlgorithm *this_local;
  
  logger._64_8_ =
       std::
       vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
       ::size(words);
  if (this->cellsLimit != 0) {
    puVar5 = std::min<unsigned_long>((unsigned_long *)&logger.quiet_,&this->cellsLimit);
    logger._64_8_ = *puVar5;
  }
  uVar2 = logger._64_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Relations used",&local_89)
  ;
  ProcessLogger::ProcessLogger
            ((ProcessLogger *)local_68,uVar2,(ostream *)&std::clog,&local_88,(bool)(this->quiet & 1)
            );
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  __n = std::
        vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ::size(words);
  this_00 = (allocator<bool> *)((long)&added.words + 7);
  std::allocator<bool>::allocator(this_00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_c8,__n,this_00);
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&added.words + 7));
  local_e0 = (undefined1  [8])local_c8;
  added.isAdded = (vector<bool,_std::allocator<bool>_> *)words;
  __x = std::
        vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ::back(words);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            (&local_f8,__x);
  Diagramm::bindWord(&this->diagramm_,&local_f8,false,true);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            (&local_f8);
  _auStack_108 = std::vector<bool,_std::allocator<bool>_>::back
                           ((vector<bool,_std::allocator<bool>_> *)local_c8);
  std::_Bit_reference::operator=((_Bit_reference *)auStack_108,true);
  ProcessLogger::iterate((ProcessLogger *)local_68);
  add.oneAdded._7_1_ = 0;
  add.oneAdded._6_1_ = 0;
  smallIt._M_current =
       (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)local_e0;
  add.this = (LargeFirstAlgorithm *)((long)&add.oneAdded + 6);
  add.force = (bool *)local_c8;
  add.words = (vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
               *)((long)&add.oneAdded + 7);
  add.added = (anon_class_16_2_0b5c3d9c *)this;
  add.isAdded = (vector<bool,_std::allocator<bool>_> *)words;
  bigIt._M_current =
       (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
       std::
       vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
       ::begin(words);
  cVar6 = std::
          vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
          ::end(words);
  _Var7 = std::
          prev<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>const*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>>
                    ((__normal_iterator<const_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
                      )cVar6._M_current,1);
  local_150 = std::
              prev<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>const*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>>
                        (_Var7,1);
  prevNotAdded.words =
       (vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        *)local_c8;
  _auStack_180 = words;
  prevNotAdded.isAdded = (vector<bool,_std::allocator<bool>_> *)words;
  do {
    do {
      iVar1 = this->maximalSmallForOneBig;
      bVar4 = true;
      local_184 = iVar1;
      while( true ) {
        bVar3 = generate::anon_class_48_6_f85bbd33::operator()
                          ((anon_class_48_6_f85bbd33 *)&smallIt,(iterator)local_150._M_current);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        if ((local_184 == 0) && (iVar1 != 0)) {
          bVar4 = false;
          break;
        }
        bVar3 = generate::anon_class_48_6_f85bbd33::operator()
                          ((anon_class_48_6_f85bbd33 *)&smallIt,(iterator)bigIt._M_current);
        if (bVar3) {
          sVar8 = ProcessLogger::iterate((ProcessLogger *)local_68);
          if ((ulong)logger._64_8_ <= sVar8) goto LAB_0021537c;
        }
        _Var7 = __gnu_cxx::
                __normal_iterator<const_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
                ::operator+(&bigIt,1);
        bigIt._M_current =
             (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
             generate::anon_class_16_2_12726816::operator()
                       ((anon_class_16_2_12726816 *)&prevNotAdded.isAdded,(iterator)_Var7._M_current
                       );
        local_184 = local_184 + -1;
      }
      if (bVar4) {
        sVar8 = ProcessLogger::iterate((ProcessLogger *)local_68);
        if ((ulong)logger._64_8_ <= sVar8) goto LAB_0021537c;
      }
      local_150._M_current =
           (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
           generate::anon_class_16_2_12726816::operator()
                     ((anon_class_16_2_12726816 *)auStack_180,(iterator)local_150._M_current);
      bVar4 = __gnu_cxx::operator>=(&bigIt,&local_150);
    } while (!bVar4);
    cVar6 = std::
            begin<std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>
                      (words);
    bigIt._M_current =
         (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
         generate::anon_class_16_2_12726816::operator()
                   ((anon_class_16_2_12726816 *)&prevNotAdded.isAdded,(iterator)cVar6._M_current);
    cVar6 = std::
            vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
            ::end(words);
    local_150._M_current =
         (vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> *)
         generate::anon_class_16_2_12726816::operator()
                   ((anon_class_16_2_12726816 *)auStack_180,(iterator)cVar6._M_current);
    if ((add.oneAdded._7_1_ & 1) == 0) {
      if (((add.oneAdded._6_1_ & 1) != 0) && ((this->quiet & 1U) == 0)) {
        if ((this->quiet & 1U) == 0) {
          poVar9 = std::operator<<((ostream *)&std::clog,"can not bind ");
          uVar2 = logger._64_8_;
          sVar8 = ProcessLogger::getIteration((ProcessLogger *)local_68);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2 - sVar8);
          std::operator<<(poVar9," relations, finishing");
        }
LAB_0021537c:
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)local_c8);
        ProcessLogger::~ProcessLogger((ProcessLogger *)local_68);
        return;
      }
      add.oneAdded._6_1_ = 1;
    }
    add.oneAdded._7_1_ = 0;
  } while( true );
}

Assistant:

void LargeFirstAlgorithm::generate(const std::vector<std::vector<GroupElement>> &words)
{
    std::size_t totalIterations = words.size();
    if (cellsLimit)
    {
        totalIterations = std::min(totalIterations, cellsLimit);
    }
    ProcessLogger logger(totalIterations, std::clog, "Relations used", quiet);

    std::vector<bool> isAdded(words.size());
    using iterator = std::vector<std::vector<GroupElement>>::const_iterator;
    auto added = [&](iterator it) {
        return isAdded[it - begin(words)];
    };
    diagramm_.bindWord(words.back(), false, true);
    isAdded.back() = true;
    logger.iterate();
    bool oneAdded = false;
    bool force = false;
    auto add = [&](iterator it) {
        if (added(it))
        {
            throw std::logic_error("trying to add already added word");
        }
        if (diagramm_.bindWord(*it, force, false))
        {
            isAdded[it - begin(words)] = true;
            oneAdded = true;
            return true;
        }
        return false;
    };
    auto smallIt = words.begin();
    auto bigIt = prev(prev(words.end()));
    auto nextNotAdded = [&](iterator it) {
        while (it < end(words) && isAdded[it - begin(words)])
            ++it;
        return it;
    };
    auto prevNotAdded = [&](iterator it) {
        while (--it >= begin(words) && isAdded[it - begin(words)])
            ;
        return it;
    };
    while (true)
    {
        int rest = maximalSmallForOneBig;
        bool infinite = rest == 0;
        bool success = true;
        while (!add(bigIt))
        {
            if (rest-- == 0 && !infinite)
            {
                success = false;
                break;
            }

            if (add(smallIt) && logger.iterate() >= totalIterations)
                return;

            smallIt = nextNotAdded(smallIt + 1);
        }

        if (success && logger.iterate() >= totalIterations)
            return;

        bigIt = prevNotAdded(bigIt);
        if (smallIt >= bigIt)
        {
            smallIt = nextNotAdded(begin(words));
            bigIt = prevNotAdded(words.end());

            if (!oneAdded)
            {
                if (force && !quiet)
                {
                    if (!quiet)
                        std::clog << "can not bind " << totalIterations - logger.getIteration() << " relations, finishing";
                    return;
                }
                force = true;
            }
            oneAdded = false;
        }
    }
}